

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O2

void jinit_d_coef_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var1;
  JDIMENSION JVar2;
  jpeg_d_coef_controller *pjVar3;
  long lVar4;
  long lVar5;
  jvirt_barray_ptr pjVar6;
  _func_void_j_decompress_ptr *p_Var7;
  code *pcVar8;
  code *pcVar9;
  long lVar10;
  int *piVar11;
  _func_int_j_decompress_ptr_JSAMPIMAGE **local_40;
  
  pjVar3 = (jpeg_d_coef_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0xe8);
  cinfo->coef = pjVar3;
  pjVar3->start_input_pass = start_input_pass;
  pjVar3->start_output_pass = start_output_pass;
  pjVar3[5].decompress_data = (_func_int_j_decompress_ptr_JSAMPIMAGE *)0x0;
  if (need_full_buffer == 0) {
    p_Var7 = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x500);
    local_40 = (_func_int_j_decompress_ptr_JSAMPIMAGE **)0x0;
    pcVar8 = decompress_onepass;
    pcVar9 = dummy_consume_data;
    for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
      (&pjVar3[1].start_output_pass)[lVar10] = p_Var7;
      p_Var7 = p_Var7 + 0x80;
    }
  }
  else {
    local_40 = &pjVar3[3].decompress_data;
    piVar11 = &cinfo->comp_info->h_samp_factor;
    for (lVar10 = 0; lVar10 < cinfo->num_components; lVar10 = lVar10 + 1) {
      JVar2 = piVar11[1] * 5;
      if (cinfo->progressive_mode == 0) {
        JVar2 = piVar11[1];
      }
      p_Var1 = cinfo->mem->request_virt_barray;
      lVar4 = jround_up((ulong)(uint)piVar11[5],(long)*piVar11);
      lVar5 = jround_up((ulong)(uint)piVar11[6],(long)piVar11[1]);
      pjVar6 = (*p_Var1)((j_common_ptr)cinfo,1,1,(JDIMENSION)lVar4,(JDIMENSION)lVar5,JVar2);
      local_40[lVar10] = (_func_int_j_decompress_ptr_JSAMPIMAGE *)pjVar6;
      piVar11 = piVar11 + 0x18;
    }
    pcVar8 = decompress_data;
    pcVar9 = consume_data;
  }
  pjVar3->consume_data = pcVar9;
  pjVar3->decompress_data = pcVar8;
  pjVar3->coef_arrays = (jvirt_barray_ptr *)local_40;
  p_Var7 = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x80);
  pjVar3[3].start_output_pass = p_Var7;
  return;
}

Assistant:

GLOBAL(void)
jinit_d_coef_controller(j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_coef_ptr coef;

  coef = (my_coef_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_coef_controller));
  cinfo->coef = (struct jpeg_d_coef_controller *)coef;
  coef->pub.start_input_pass = start_input_pass;
  coef->pub.start_output_pass = start_output_pass;
#ifdef BLOCK_SMOOTHING_SUPPORTED
  coef->coef_bits_latch = NULL;
#endif

  /* Create the coefficient buffer. */
  if (need_full_buffer) {
#ifdef D_MULTISCAN_FILES_SUPPORTED
    /* Allocate a full-image virtual array for each component, */
    /* padded to a multiple of samp_factor DCT blocks in each direction. */
    /* Note we ask for a pre-zeroed array. */
    int ci, access_rows;
    jpeg_component_info *compptr;

    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      access_rows = compptr->v_samp_factor;
#ifdef BLOCK_SMOOTHING_SUPPORTED
      /* If block smoothing could be used, need a bigger window */
      if (cinfo->progressive_mode)
        access_rows *= 5;
#endif
      coef->whole_image[ci] = (*cinfo->mem->request_virt_barray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE, TRUE,
         (JDIMENSION)jround_up((long)compptr->width_in_blocks,
                               (long)compptr->h_samp_factor),
         (JDIMENSION)jround_up((long)compptr->height_in_blocks,
                               (long)compptr->v_samp_factor),
         (JDIMENSION)access_rows);
    }
    coef->pub.consume_data = consume_data;
    coef->pub.decompress_data = decompress_data;
    coef->pub.coef_arrays = coef->whole_image; /* link to virtual arrays */
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    /* We only need a single-MCU buffer. */
    JBLOCKROW buffer;
    int i;

    buffer = (JBLOCKROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  D_MAX_BLOCKS_IN_MCU * sizeof(JBLOCK));
    for (i = 0; i < D_MAX_BLOCKS_IN_MCU; i++) {
      coef->MCU_buffer[i] = buffer + i;
    }
    coef->pub.consume_data = dummy_consume_data;
    coef->pub.decompress_data = decompress_onepass;
    coef->pub.coef_arrays = NULL; /* flag for no virtual arrays */
  }

  /* Allocate the workspace buffer */
  coef->workspace = (JCOEF *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(JCOEF) * DCTSIZE2);
}